

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall
TPZManVector<TPZGeoEl_*,_4>::Resize
          (TPZManVector<TPZGeoEl_*,_4> *this,int64_t newsize,TPZGeoEl **object)

{
  TPZGeoEl **ppTVar1;
  TPZGeoEl *pTVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  TPZGeoEl **ppTVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int64_t i;
  ulong uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::ostream::flush();
    return;
  }
  lVar7 = (this->super_TPZVec<TPZGeoEl_*>).fNElements;
  if (lVar7 != newsize) {
    lVar6 = (this->super_TPZVec<TPZGeoEl_*>).fNAlloc;
    if (lVar6 < newsize) {
      if ((ulong)newsize < 5) {
        if (lVar7 < 1) {
          lVar7 = 0;
        }
        else {
          ppTVar5 = (this->super_TPZVec<TPZGeoEl_*>).fStore;
          lVar6 = 0;
          do {
            this->fExtAlloc[lVar6] = ppTVar5[lVar6];
            lVar6 = lVar6 + 1;
          } while (lVar7 != lVar6);
        }
        auVar4 = _DAT_014d28c0;
        auVar3 = _DAT_014d28b0;
        lVar6 = newsize - lVar7;
        if (lVar6 != 0 && lVar7 <= newsize) {
          pTVar2 = *object;
          lVar8 = lVar6 + -1;
          auVar11._8_4_ = (int)lVar8;
          auVar11._0_8_ = lVar8;
          auVar11._12_4_ = (int)((ulong)lVar8 >> 0x20);
          uVar10 = 0;
          auVar11 = auVar11 ^ _DAT_014d28c0;
          do {
            auVar14._8_4_ = (int)uVar10;
            auVar14._0_8_ = uVar10;
            auVar14._12_4_ = (int)(uVar10 >> 0x20);
            auVar15 = (auVar14 | auVar3) ^ auVar4;
            if ((bool)(~(auVar15._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar15._0_4_ ||
                        auVar11._4_4_ < auVar15._4_4_) & 1)) {
              this->fExtAlloc[lVar7 + uVar10] = pTVar2;
            }
            if ((auVar15._12_4_ != auVar11._12_4_ || auVar15._8_4_ <= auVar11._8_4_) &&
                auVar15._12_4_ <= auVar11._12_4_) {
              this->fExtAlloc[lVar7 + uVar10 + 1] = pTVar2;
            }
            uVar10 = uVar10 + 2;
          } while ((lVar6 + 1U & 0xfffffffffffffffe) != uVar10);
        }
        ppTVar5 = (this->super_TPZVec<TPZGeoEl_*>).fStore;
        if (ppTVar5 != (TPZGeoEl **)0x0 && ppTVar5 != this->fExtAlloc) {
          operator_delete__(ppTVar5);
        }
        (this->super_TPZVec<TPZGeoEl_*>).fStore = this->fExtAlloc;
        (this->super_TPZVec<TPZGeoEl_*>).fNElements = newsize;
        (this->super_TPZVec<TPZGeoEl_*>).fNAlloc = 4;
      }
      else {
        dVar12 = (double)lVar6 * 1.2;
        uVar10 = (long)dVar12;
        if (dVar12 < (double)newsize) {
          uVar10 = newsize;
        }
        ppTVar5 = (TPZGeoEl **)operator_new__(-(ulong)(uVar10 >> 0x3d != 0) | uVar10 * 8);
        lVar6 = 0;
        if (0 < lVar7) {
          ppTVar1 = (this->super_TPZVec<TPZGeoEl_*>).fStore;
          lVar8 = 0;
          do {
            ppTVar5[lVar8] = ppTVar1[lVar8];
            lVar8 = lVar8 + 1;
            lVar6 = lVar7;
          } while (lVar7 != lVar8);
        }
        auVar4 = _DAT_014d28c0;
        auVar3 = _DAT_014d28b0;
        lVar7 = newsize - lVar6;
        if (lVar7 != 0 && lVar6 <= newsize) {
          pTVar2 = *object;
          lVar8 = lVar7 + -1;
          auVar15._8_4_ = (int)lVar8;
          auVar15._0_8_ = lVar8;
          auVar15._12_4_ = (int)((ulong)lVar8 >> 0x20);
          uVar9 = 0;
          auVar15 = auVar15 ^ _DAT_014d28c0;
          do {
            auVar13._8_4_ = (int)uVar9;
            auVar13._0_8_ = uVar9;
            auVar13._12_4_ = (int)(uVar9 >> 0x20);
            auVar13 = (auVar13 | auVar3) ^ auVar4;
            if ((bool)(~(auVar13._4_4_ == auVar15._4_4_ && auVar15._0_4_ < auVar13._0_4_ ||
                        auVar15._4_4_ < auVar13._4_4_) & 1)) {
              ppTVar5[lVar6 + uVar9] = pTVar2;
            }
            if ((auVar13._12_4_ != auVar15._12_4_ || auVar13._8_4_ <= auVar15._8_4_) &&
                auVar13._12_4_ <= auVar15._12_4_) {
              ppTVar5[lVar6 + uVar9 + 1] = pTVar2;
            }
            uVar9 = uVar9 + 2;
          } while ((lVar7 + 1U & 0xfffffffffffffffe) != uVar9);
        }
        ppTVar1 = (this->super_TPZVec<TPZGeoEl_*>).fStore;
        if (ppTVar1 != (TPZGeoEl **)0x0 && ppTVar1 != this->fExtAlloc) {
          operator_delete__(ppTVar1);
        }
        (this->super_TPZVec<TPZGeoEl_*>).fStore = ppTVar5;
        (this->super_TPZVec<TPZGeoEl_*>).fNElements = newsize;
        (this->super_TPZVec<TPZGeoEl_*>).fNAlloc = uVar10;
      }
    }
    else {
      if (lVar7 < newsize) {
        pTVar2 = *object;
        do {
          (this->super_TPZVec<TPZGeoEl_*>).fStore[lVar7] = pTVar2;
          lVar7 = lVar7 + 1;
        } while (newsize != lVar7);
      }
      (this->super_TPZVec<TPZGeoEl_*>).fNElements = newsize;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}